

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O3

bool ccs::CcsContext::coerceString<bool>(string *s,bool *dest)

{
  size_t sVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"true","");
  plVar2 = local_48;
  sVar1 = s->_M_string_length;
  if (sVar1 == local_40) {
    if (sVar1 == 0) {
      bVar5 = true;
    }
    else {
      iVar4 = bcmp((s->_M_dataplus)._M_p,local_48,sVar1);
      bVar5 = iVar4 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (plVar2 != local_38) {
    operator_delete(plVar2,local_38[0] + 1);
  }
  bVar3 = true;
  if (!bVar5) {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"false","");
    plVar2 = local_48;
    sVar1 = s->_M_string_length;
    if (sVar1 == local_40) {
      if (sVar1 == 0) {
        bVar5 = true;
      }
      else {
        iVar4 = bcmp((s->_M_dataplus)._M_p,local_48,sVar1);
        bVar5 = iVar4 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (plVar2 != local_38) {
      operator_delete(plVar2,local_38[0] + 1);
    }
    bVar3 = false;
    if (!bVar5) {
      return false;
    }
  }
  *dest = bVar3;
  return true;
}

Assistant:

inline bool CcsContext::coerceString<bool>(const std::string &s,
    bool &dest) {
  // convert from a string to a bool: value must be exactly "true" or "false",
  // for maximum consistency with ccs boolean literals.
  if (s == std::string("true")) {
    dest = true;
    return true;
  }
  if (s == std::string("false")) {
    dest = false;
    return true;
  }
  return false;
}